

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QSsl::ImplementedClass>::emplace<QSsl::ImplementedClass&>
          (QPodArrayOps<QSsl::ImplementedClass> *this,qsizetype i,ImplementedClass *args)

{
  qsizetype *pqVar1;
  ImplementedClass IVar2;
  Data *pDVar3;
  long lVar4;
  qsizetype qVar5;
  ImplementedClass *pIVar6;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QSsl::ImplementedClass>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<QSsl::ImplementedClass>).size == i) &&
       (qVar5 = QArrayDataPointer<QSsl::ImplementedClass>::freeSpaceAtEnd
                          (&this->super_QArrayDataPointer<QSsl::ImplementedClass>), qVar5 != 0)) {
      lVar4 = (this->super_QArrayDataPointer<QSsl::ImplementedClass>).size;
      (this->super_QArrayDataPointer<QSsl::ImplementedClass>).ptr[lVar4] = *args;
      (this->super_QArrayDataPointer<QSsl::ImplementedClass>).size = lVar4 + 1;
      return;
    }
    if ((i == 0) &&
       (qVar5 = QArrayDataPointer<QSsl::ImplementedClass>::freeSpaceAtBegin
                          (&this->super_QArrayDataPointer<QSsl::ImplementedClass>), qVar5 != 0)) {
      pIVar6 = (this->super_QArrayDataPointer<QSsl::ImplementedClass>).ptr;
      pIVar6[-1] = *args;
      (this->super_QArrayDataPointer<QSsl::ImplementedClass>).ptr = pIVar6 + -1;
      pqVar1 = &(this->super_QArrayDataPointer<QSsl::ImplementedClass>).size;
      *pqVar1 = *pqVar1 + 1;
      return;
    }
  }
  IVar2 = *args;
  where = (GrowthPosition)
          (i == 0 && (this->super_QArrayDataPointer<QSsl::ImplementedClass>).size != 0);
  QArrayDataPointer<QSsl::ImplementedClass>::detachAndGrow
            (&this->super_QArrayDataPointer<QSsl::ImplementedClass>,where,1,(ImplementedClass **)0x0
             ,(QArrayDataPointer<QSsl::ImplementedClass> *)0x0);
  pIVar6 = createHole(this,where,i,1);
  *pIVar6 = IVar2;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }